

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U>::rehash
          (SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  Node *pNVar4;
  Node *item;
  uint i;
  Node *oldData;
  uint oldBucketCount;
  SmallDenseMap<unsigned_int,_ExternFuncInfo_*,_SmallDenseMapUnsignedHasher,_32U> *this_local;
  
  uVar1 = this->bucketCount;
  pNVar2 = this->data;
  this->bucketCount = this->bucketCount << 1;
  if (this->allocator == (Allocator *)0x0) {
    pNVar4 = (Node *)(*(code *)NULLC::alloc)(((ulong)this->bucketCount & 0xfffffff) << 4);
    this->data = pNVar4;
  }
  else {
    iVar3 = (*this->allocator->_vptr_Allocator[2])();
    this->data = (Node *)CONCAT44(extraout_var,iVar3);
  }
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 4);
  this->count = 0;
  for (item._4_4_ = 0; item._4_4_ < uVar1; item._4_4_ = item._4_4_ + 1) {
    pNVar4 = pNVar2 + item._4_4_;
    if (pNVar4->key != 0) {
      insert(this,&pNVar4->key,&pNVar4->value);
    }
  }
  if (pNVar2 != this->storage) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pNVar2);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,pNVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Node *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		else
			data = (Node*)NULLC::alloc(sizeof(Node) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Node &item = oldData[i];

			if(item.key == Key())
				continue;

			insert(item.key, item.value);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}